

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest> * __thiscall
testing::internal::ParameterizedTestCaseRegistry::
GetTestCasePatternHolder<gurkenlaeufer::detail::CucumberTest>
          (ParameterizedTestCaseRegistry *this,char *test_case_name,CodeLocation *code_location)

{
  bool bVar1;
  int iVar2;
  reference ppPVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeId pvVar4;
  ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest> *this_00;
  value_type local_a8;
  undefined1 local_99;
  CodeLocation local_98;
  CodeLocation local_60;
  __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
  local_38;
  __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
  local_30;
  iterator it;
  ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest> *typed_test_info;
  CodeLocation *code_location_local;
  char *test_case_name_local;
  ParameterizedTestCaseRegistry *this_local;
  
  it._M_current = (ParameterizedTestCaseInfoBase **)0x0;
  local_30._M_current =
       (ParameterizedTestCaseInfoBase **)
       std::
       vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
       ::begin(&this->test_case_infos_);
  do {
    local_38._M_current =
         (ParameterizedTestCaseInfoBase **)
         std::
         vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
         ::end(&this->test_case_infos_);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) {
LAB_001d136c:
      if (it._M_current == (ParameterizedTestCaseInfoBase **)0x0) {
        this_00 = (ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest> *)
                  operator_new(0x80);
        local_99 = 1;
        CodeLocation::CodeLocation(&local_98,code_location);
        ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::ParameterizedTestCaseInfo
                  (this_00,test_case_name,&local_98);
        local_99 = 0;
        it._M_current = (ParameterizedTestCaseInfoBase **)this_00;
        CodeLocation::~CodeLocation(&local_98);
        local_a8 = (value_type)it._M_current;
        std::
        vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
        ::push_back(&this->test_case_infos_,&local_a8);
      }
      return (ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest> *)it._M_current;
    }
    ppPVar3 = __gnu_cxx::
              __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
              ::operator*(&local_30);
    iVar2 = (*(*ppPVar3)->_vptr_ParameterizedTestCaseInfoBase[2])();
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var,iVar2),test_case_name);
    if (bVar1) {
      ppPVar3 = __gnu_cxx::
                __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
                ::operator*(&local_30);
      iVar2 = (*(*ppPVar3)->_vptr_ParameterizedTestCaseInfoBase[3])();
      pvVar4 = GetTypeId<gurkenlaeufer::detail::CucumberTest>();
      if ((TypeId)CONCAT44(extraout_var_00,iVar2) == pvVar4) {
        ppPVar3 = __gnu_cxx::
                  __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
                  ::operator*(&local_30);
        it._M_current =
             (ParameterizedTestCaseInfoBase **)
             CheckedDowncastToActualType<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>,testing::internal::ParameterizedTestCaseInfoBase>
                       (*ppPVar3);
      }
      else {
        CodeLocation::CodeLocation(&local_60,code_location);
        ReportInvalidTestCaseType(test_case_name,&local_60);
        CodeLocation::~CodeLocation(&local_60);
        posix::Abort();
      }
      goto LAB_001d136c;
    }
    __gnu_cxx::
    __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

ParameterizedTestCaseInfo<TestCase>* GetTestCasePatternHolder(
      const char* test_case_name,
      CodeLocation code_location) {
    ParameterizedTestCaseInfo<TestCase>* typed_test_info = NULL;
    for (TestCaseInfoContainer::iterator it = test_case_infos_.begin();
         it != test_case_infos_.end(); ++it) {
      if ((*it)->GetTestCaseName() == test_case_name) {
        if ((*it)->GetTestCaseTypeId() != GetTypeId<TestCase>()) {
          // Complain about incorrect usage of Google Test facilities
          // and terminate the program since we cannot guaranty correct
          // test case setup and tear-down in this case.
          ReportInvalidTestCaseType(test_case_name, code_location);
          posix::Abort();
        } else {
          // At this point we are sure that the object we found is of the same
          // type we are looking for, so we downcast it to that type
          // without further checks.
          typed_test_info = CheckedDowncastToActualType<
              ParameterizedTestCaseInfo<TestCase> >(*it);
        }
        break;
      }
    }
    if (typed_test_info == NULL) {
      typed_test_info = new ParameterizedTestCaseInfo<TestCase>(
          test_case_name, code_location);
      test_case_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }